

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O0

void so_5::ensure_message_with_actual_data<so_5::stats::messages::distribution_started>
               (distribution_started *m)

{
  exception_t *this;
  allocator local_31;
  string local_30 [32];
  distribution_started *local_10;
  distribution_started *m_local;
  
  local_10 = m;
  ensure_not_signal<so_5::stats::messages::distribution_started>();
  if (local_10 == (distribution_started *)0x0) {
    this = (exception_t *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"an attempt to send a message via nullptr",&local_31);
    exception_t::exception_t(this,(string *)local_30,0x52);
    __cxa_throw(this,&exception_t::typeinfo,exception_t::~exception_t);
  }
  return;
}

Assistant:

void
ensure_message_with_actual_data( const MSG * m )
{
	ensure_not_signal< MSG >();

	if( !m )
		throw so_5::exception_t(
				"an attempt to send a message via nullptr",
				so_5::rc_null_message_data );
}